

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O1

int ndn_signed_interest_hmac_sign
              (ndn_interest_t *interest,ndn_name_t *identity,ndn_hmac_key_t *hmac_key)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint8_t uVar8;
  void *pvVar7;
  name_component_t *component;
  ulong uVar9;
  bool bVar10;
  uint8_t local_2f8 [8];
  uint8_t be_signed [680];
  uint32_t local_44;
  undefined1 auStack_40 [4];
  uint32_t used_bytes;
  uint local_38;
  uint uStack_34;
  
  if (9 < (interest->name).components_size) {
    return -10;
  }
  _prepare_signature_info(interest,'\x04',identity,hmac_key->key_id);
  memset(local_2f8,0,0x2a8);
  pvVar7 = memset(local_2f8,0,0x2a8);
  iVar5 = (int)pvVar7;
  local_38 = 0x2a8;
  uStack_34 = 0;
  bVar10 = (interest->name).components_size != '\0';
  be_signed._672_8_ = hmac_key;
  _auStack_40 = local_2f8;
  if ((bVar10) &&
     (iVar5 = name_component_tlv_encode((ndn_encoder_t *)auStack_40,(name_component_t *)interest),
     iVar5 == 0)) {
    component = (interest->name).components;
    uVar9 = 0;
    do {
      component = component + 1;
      uVar9 = uVar9 + 1;
      bVar10 = uVar9 < (interest->name).components_size;
      if (!bVar10) break;
      iVar5 = name_component_tlv_encode((ndn_encoder_t *)auStack_40,component);
    } while (iVar5 == 0);
  }
  uVar4 = uStack_34;
  if (bVar10) {
    return iVar5;
  }
  uVar9 = (ulong)uStack_34;
  if ((interest->flags & 0x40) == 0) goto LAB_00110ade;
  if (local_38 == uStack_34) {
    return -0xe;
  }
  _auStack_40[uVar9] = '$';
  uVar1 = uStack_34 + 1;
  uVar3 = (interest->parameters).size;
  if (uVar3 < 0xfd && local_38 != uVar1) {
    iVar5 = 1;
    uStack_34 = uVar1;
LAB_00110c75:
    _auStack_40[uStack_34] = (uint8_t)uVar3;
    iVar6 = 0;
    bVar10 = true;
    uStack_34 = uVar1 + iVar5;
  }
  else {
    uVar8 = (uint8_t)(uVar3 >> 8);
    if (2 < local_38 - uVar1 && uVar3 < 0x10000) {
      _auStack_40[uVar1] = 0xfd;
      _auStack_40[uStack_34 + 2] = uVar8;
      uStack_34 = uStack_34 + 3;
      iVar5 = 3;
      goto LAB_00110c75;
    }
    if (4 < local_38 - uVar1) {
      _auStack_40[uVar1] = 0xfe;
      _auStack_40[uStack_34 + 2] = (uint8_t)(uVar3 >> 0x18);
      _auStack_40[uStack_34 + 3] = (uint8_t)(uVar3 >> 0x10);
      _auStack_40[uStack_34 + 4] = uVar8;
      uStack_34 = uStack_34 + 5;
      iVar5 = 5;
      goto LAB_00110c75;
    }
    iVar6 = -0xe;
    bVar10 = false;
    uStack_34 = uVar1;
  }
  if (!bVar10) {
    return iVar6;
  }
  uVar1 = (interest->parameters).size;
  if ((int)(local_38 - uStack_34) < (int)uVar1) {
    return -10;
  }
  memcpy(_auStack_40 + uStack_34,&interest->parameters,(ulong)uVar1);
  uStack_34 = uStack_34 + uVar1;
LAB_00110ade:
  iVar5 = ndn_signature_info_tlv_encode((ndn_encoder_t *)auStack_40,&interest->signature);
  if (iVar5 == 0) {
    local_44 = 0;
    iVar5 = ndn_hmac_sign(_auStack_40,uStack_34,(interest->signature).sig_value,0x80,
                          (ndn_hmac_key_t *)be_signed._672_8_,&local_44);
    if (-1 < iVar5) {
      (interest->signature).sig_size = local_44;
      iVar5 = ndn_signature_value_tlv_encode((ndn_encoder_t *)auStack_40,&interest->signature);
      if ((iVar5 == 0) &&
         (iVar5 = ndn_sha256(_auStack_40 + uVar9,uStack_34 - uVar4,
                             (interest->name).components[(interest->name).components_size].value),
         -1 < iVar5)) {
        bVar2 = (interest->name).components_size;
        (interest->name).components[bVar2].type = 2;
        (interest->name).components[bVar2].size = ' ';
        (interest->name).components_size = bVar2 + 1;
        interest->flags = interest->flags | 0x80;
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int
ndn_signed_interest_hmac_sign(ndn_interest_t* interest,
                              const ndn_name_t* identity, const ndn_hmac_key_t* hmac_key)
{
  int ret_val = -1;
  if (interest->name.components_size + 1 > NDN_NAME_COMPONENTS_SIZE)
    return NDN_OVERSIZE;

  // set signature info
  _prepare_signature_info(interest, NDN_SIG_TYPE_HMAC_SHA256, identity, hmac_key->key_id);

  // update signature value and append the ending name component
  // prepare temp buffer to calculate signature value and the ending name component
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);
  // the signing input starts at Name's Value (V)
  for (size_t i = 0; i < interest->name.components_size; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;

  // calculate signature
  // signature is calculated over Name + Parameters + SignatureInfo
  uint32_t used_bytes = 0;
  int result = NDN_SUCCESS;
  result = ndn_hmac_sign(temp_encoder.output_value, siginfo_block_ending,
                         interest->signature.sig_value, NDN_SIGNATURE_BUFFER_SIZE,
                         hmac_key, &used_bytes);
  if (result < 0) return result;
  interest->signature.sig_size = used_bytes;

  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // calculate the SignedInterestSha256DigestComponent
  // component is calculated over Name + Parameters + SignatureInfo + SignatureValue
  result = ndn_sha256(&temp_encoder.output_value[param_block_starting],
                      temp_encoder.offset - param_block_starting,
                      interest->name.components[interest->name.components_size].value);
  if (result < 0) return result;
  interest->name.components[interest->name.components_size].type = TLV_ParametersSha256DigestComponent;
  interest->name.components[interest->name.components_size].size = NDN_SEC_SHA256_HASH_SIZE;
  interest->name.components_size++;
  BIT_SET(interest->flags, 7);
  return NDN_SUCCESS;
}